

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdAddSighashTypeInSchnorrSignature
              (void *handle,char *signature,int sighash_type,bool anyone_can_pay,
              char **added_signature)

{
  bool bVar1;
  undefined8 uVar2;
  char *pcVar3;
  byte in_CL;
  uint8_t in_DL;
  char *in_RSI;
  undefined8 *in_R8;
  CfdException *except;
  exception *std_except;
  SigHashType sighash_type_obj;
  SchnorrSignature sig;
  int result;
  string *in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffe70;
  allocator *paVar4;
  string *in_stack_fffffffffffffeb0;
  string local_138;
  SigHashType local_118;
  allocator local_109;
  string local_108;
  SchnorrSignature local_e8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  CfdSourceLocation local_98;
  undefined1 local_7a;
  allocator local_79;
  string local_78 [32];
  CfdSourceLocation local_58;
  undefined4 local_2c;
  undefined8 *local_28;
  byte local_1d;
  uint8_t local_1c;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  local_1d = in_CL & 1;
  local_2c = 0xffffffff;
  local_28 = in_R8;
  local_18 = in_RSI;
  local_1c = in_DL;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (bVar1) {
    local_58.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_58.filename = local_58.filename + 1;
    local_58.line = 0x2c7;
    local_58.funcname = "CfdAddSighashTypeInSchnorrSignature";
    cfd::core::logger::warn<>(&local_58,"signature is null or empty.");
    local_7a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_78,"Failed to parameter. signature is null or empty.",&local_79);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe70,error_code,in_stack_fffffffffffffe60);
    local_7a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_28 == (undefined8 *)0x0) {
    local_98.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_98.filename = local_98.filename + 1;
    local_98.line = 0x2cd;
    local_98.funcname = "CfdAddSighashTypeInSchnorrSignature";
    cfd::core::logger::warn<>(&local_98,"added_signature is null or empty.");
    local_ba = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_b8,"Failed to parameter. added_signature is null or empty.",&local_b9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe70,error_code,in_stack_fffffffffffffe60);
    local_ba = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  paVar4 = &local_109;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,local_18,paVar4);
  cfd::core::SchnorrSignature::SchnorrSignature(&local_e8,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  cfd::core::SigHashType::Create(&local_118,local_1c,(bool)(local_1d & 1),false);
  cfd::core::SchnorrSignature::SetSigHashType(&local_e8,&local_118);
  cfd::core::SchnorrSignature::GetData((ByteData *)&stack0xfffffffffffffeb0,&local_e8,true);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_138,(ByteData *)&stack0xfffffffffffffeb0);
  pcVar3 = cfd::capi::CreateString(in_stack_fffffffffffffeb0);
  *local_28 = pcVar3;
  std::__cxx11::string::~string((string *)&local_138);
  cfd::core::ByteData::~ByteData((ByteData *)0x5d1cb1);
  local_4 = 0;
  cfd::core::SchnorrSignature::~SchnorrSignature((SchnorrSignature *)0x5d1cc9);
  return local_4;
}

Assistant:

int CfdAddSighashTypeInSchnorrSignature(
    void* handle, const char* signature, int sighash_type, bool anyone_can_pay,
    char** added_signature) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    if (added_signature == nullptr) {
      warn(CFD_LOG_SOURCE, "added_signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. added_signature is null or empty.");
    }
    SchnorrSignature sig(signature);
    SigHashType sighash_type_obj = SigHashType::Create(
        static_cast<uint8_t>(sighash_type), anyone_can_pay);
    sig.SetSigHashType(sighash_type_obj);
    *added_signature = CreateString(sig.GetData(true).GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}